

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QRect __thiscall QAccessibleMdiSubWindow::rect(QAccessibleMdiSubWindow *this)

{
  long lVar1;
  QWidget *pQVar2;
  QPoint QVar3;
  QSize QVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect QVar8;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  if ((*(byte *)(*(long *)(lVar1 + 0x20) + 10) & 1) == 0) {
    lVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    if (*(long *)(*(long *)(lVar1 + 8) + 0x10) == 0) {
      QVar7 = QAccessibleWidget::rect(&this->super_QAccessibleWidget);
      uVar6 = QVar7._0_8_ >> 0x20;
      uVar5 = QVar7._8_8_ >> 0x20;
    }
    else {
      pQVar2 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      local_30.xp.m_i = 0;
      local_30.yp.m_i = 0;
      QVar3 = QWidget::mapToGlobal(pQVar2,&local_30);
      uVar6 = (ulong)QVar3 >> 0x20;
      pQVar2 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      QVar4 = QWidget::size(pQVar2);
      QVar7._8_8_ = (long)QVar3 + 0xffffffff + (long)QVar4;
      QVar7.x1.m_i = QVar3.xp.m_i;
      QVar7.y1.m_i = QVar3.yp.m_i;
      uVar5 = (ulong)(uint)(QVar4.ht.m_i.m_i + QVar3.yp.m_i.m_i + -1);
    }
  }
  else {
    QVar7 = (QRect)(ZEXT816(0xffffffff) << 0x40);
    uVar6 = 0;
    uVar5 = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    uVar6 = QVar7._0_8_ & 0xffffffff | uVar6 << 0x20;
    QVar8._8_8_ = QVar7._8_8_ & 0xffffffff | uVar5 << 0x20;
    QVar8.x1.m_i = (int)uVar6;
    QVar8.y1.m_i = (int)(uVar6 >> 0x20);
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleMdiSubWindow::rect() const
{
    if (mdiSubWindow()->isHidden())
        return QRect();
    if (!mdiSubWindow()->parent())
        return QAccessibleWidget::rect();
    const QPoint pos = mdiSubWindow()->mapToGlobal(QPoint(0, 0));
    return QRect(pos, mdiSubWindow()->size());
}